

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string *s;
  int algo;
  my_queue agenda;
  State end;
  string in;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  State start;
  set<State,_std::less<State>,_std::allocator<State>_> closedSet;
  
  in._M_dataplus._M_p = (pointer)&in.field_2;
  in._M_string_length = 0;
  in.field_2._M_local_buf[0] = '\0';
  State::State(&start);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "Do you want to generate a random configuration? (Y/n)");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<(poVar3,"If not, the project\'s default one will be used: ");
  std::operator>>((istream *)&std::cin,(string *)&in);
  iVar2 = tolower((int)*in._M_dataplus._M_p);
  if (iVar2 != 0x6e) {
    std::operator<<((ostream *)&std::cout,"Insert width: ");
    std::istream::operator>>((istream *)&std::cin,(int *)&closedSet);
    std::operator<<((ostream *)&std::cout,"Insert height: ");
    std::istream::operator>>((istream *)&std::cin,(int *)&end);
    do {
      State::State((State *)&agenda,closedSet._M_t._M_impl._0_4_,(int)end.tiles);
      State::operator=(&start,(State *)&agenda);
      State::~State((State *)&agenda);
      poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar3 = std::operator<<(poVar3,"Start: ");
      poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
      State::toString_abi_cxx11_((string *)&agenda,&start);
      poVar3 = std::operator<<(poVar3,(string *)&agenda);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&agenda);
      bVar1 = State::isSolvable(&start);
      if (bVar1) goto LAB_00102493;
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "Starting layout is not solvable! Try again? (Y/n)");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::operator>>((istream *)&std::cin,(string *)&in);
      iVar2 = tolower((int)*in._M_dataplus._M_p);
    } while (iVar2 != 0x6e);
    goto LAB_00102891;
  }
  closedSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x200000003;
  closedSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x500000008;
  closedSet._M_t._M_impl._0_8_ = 0x700000006;
  closedSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_black;
  closedSet._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  closedSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)CONCAT44(closedSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,4);
  State::State((State *)&agenda,3,3,(int *)&closedSet);
  State::operator=(&start,(State *)&agenda);
  State::~State((State *)&agenda);
LAB_00102493:
  poVar3 = std::operator<<((ostream *)&std::cout,"Select algorithm (1/2/3): ");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,"1) Depth First Search");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,"2) Breadth First Search");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,"3) Best First Search");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::istream::operator>>((istream *)&std::cin,&algo);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::chrono::_V2::system_clock::now();
  State::State(&end);
  closedSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &closedSet._M_t._M_impl.super__Rb_tree_header._M_header;
  closedSet._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       closedSet._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  closedSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  closedSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  closedSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       closedSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (algo == 1) {
    std::stack<State,std::deque<State,std::allocator<State>>>::
    stack<std::deque<State,std::allocator<State>>,void>
              ((stack<State,_std::deque<State,_std::allocator<State>_>_> *)&agenda);
    std::deque<State,_std::allocator<State>_>::push_back
              ((deque<State,_std::allocator<State>_> *)&agenda,&start);
    iVar2 = search<std::stack<State,std::deque<State,std::allocator<State>>>>
                      (&end,&closedSet,
                       (stack<State,_std::deque<State,_std::allocator<State>_>_> *)&agenda);
LAB_001026ec:
    std::deque<State,_std::allocator<State>_>::~deque
              ((deque<State,_std::allocator<State>_> *)&agenda);
  }
  else {
    if (algo == 2) {
      std::queue<State,std::deque<State,std::allocator<State>>>::
      queue<std::deque<State,std::allocator<State>>,void>
                (&agenda.super_queue<State,_std::deque<State,_std::allocator<State>_>_>);
      std::deque<State,_std::allocator<State>_>::push_back
                ((deque<State,_std::allocator<State>_> *)&agenda,&start);
      iVar2 = search<my_queue>(&end,&closedSet,&agenda);
      goto LAB_001026ec;
    }
    agenda.super_queue<State,_std::deque<State,_std::allocator<State>_>_>.c.
    super__Deque_base<State,_std::allocator<State>_>._M_impl.super__Deque_impl_data._M_map =
         (_Map_pointer)0x0;
    agenda.super_queue<State,_std::deque<State,_std::allocator<State>_>_>.c.
    super__Deque_base<State,_std::allocator<State>_>._M_impl.super__Deque_impl_data._M_map_size = 0;
    agenda.super_queue<State,_std::deque<State,_std::allocator<State>_>_>.c.
    super__Deque_base<State,_std::allocator<State>_>._M_impl.super__Deque_impl_data._M_start._M_cur
         = (_Elt_pointer)0x0;
    std::priority_queue<State,_std::vector<State,_std::allocator<State>_>,_compareStates>::push
              ((priority_queue<State,_std::vector<State,_std::allocator<State>_>,_compareStates> *)
               &agenda,&start);
    iVar2 = search<my_priority_queue>(&end,&closedSet,(my_priority_queue *)&agenda);
    std::vector<State,_std::allocator<State>_>::~vector
              ((vector<State,_std::allocator<State>_> *)&agenda);
  }
  if (iVar2 < 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"No solution!");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    std::chrono::_V2::system_clock::now();
    poVar3 = std::operator<<((ostream *)&std::cout,"Solution:");
    std::endl<char,std::char_traits<char>>(poVar3);
    State::getPath_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&agenda,&end);
    State::getPath_abi_cxx11_(&local_a8,&end);
    for (; local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               (string *)
                               local_a8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a8);
    poVar3 = std::operator<<((ostream *)&std::cout,"Completed in ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," steps.");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," iterations / ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3,"ms");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&agenda);
  }
  std::_Rb_tree<State,_State,_std::_Identity<State>,_std::less<State>,_std::allocator<State>_>::
  ~_Rb_tree(&closedSet._M_t);
  State::~State(&end);
LAB_00102891:
  State::~State(&start);
  std::__cxx11::string::~string((string *)&in);
  return 0;
}

Assistant:

int main() {
    std::string in;
    State start;

    std::cout << "Do you want to generate a random configuration? (Y/n)" << std::endl
              << "If not, the project's default one will be used: ";
    std::cin >> in;

    if (std::tolower(in[0]) == 'n') {
        int numbers[] = {6, 7, 1, 0, 3, 2, 8, 5, 4};
        start = State(3, 3, numbers);
    } else {
        int width, height;
        std::cout << "Insert width: ";
        std::cin >> width;
        std::cout << "Insert height: ";
        std::cin >> height;

        bool ok = false;
        while (!ok) {
            start = State(width, height);
            std::cout << std::endl
                      << "Start: " << std::endl
                      << start.toString() << std::endl;

            ok = start.isSolvable();

            if (!ok) {
                std::cout << "Starting layout is not solvable! Try again? (Y/n)" << std::endl;
                std::cin >> in;

                if (std::tolower(in[0]) == 'n')
                    return 0;
            }
        }
    }

    int algo;
    std::cout << "Select algorithm (1/2/3): " << std::endl
              << "1) Depth First Search" << std::endl
              << "2) Breadth First Search" << std::endl
              << "3) Best First Search" << std::endl;
    std::cin >> algo;
    std::cout << std::endl;

    int iterations;
    auto time0 = std::chrono::high_resolution_clock::now();

    State end;
    std::set<State> closedSet;

    switch (algo) {
        case 1: {
            std::stack<State> agenda;
            agenda.push(start);
            iterations = dfs(end, closedSet, agenda);
            break;
        }

        case 2: {
            my_queue agenda;
            agenda.push(start);
            iterations = bfs(end, closedSet, agenda);
            break;
        }

        default: {
            my_priority_queue agenda;
            agenda.push(start);
            iterations = bestfs(end, closedSet, agenda);
            break;
        }
    }

    if (iterations > 0) {
        auto time1 = std::chrono::high_resolution_clock::now();
        auto ms = std::chrono::duration_cast<std::chrono::milliseconds>(time1 - time0).count();

        std::cout << "Solution:" << std::endl;
        std::vector<std::string> path = end.getPath();
        for (std::string &s : end.getPath()) {
            std::cout << s << std::endl;
        }

        std::cout << "Completed in " << path.size() - 1 << " steps." << std::endl
                  << iterations << " iterations / " << ms << "ms" << std::endl;
    } else {
        std::cout << "No solution!" << std::endl;
    }

    return 0;
}